

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.c
# Opt level: O0

void do_pseudo(int *ip)

{
  int iVar1;
  uint uVar2;
  char check_opval_flag;
  int size;
  int old_bank;
  char str [80];
  int *ip_local;
  
  if (((int)pseudo_flag[opval] & 1 << ((byte)section & 0x1f)) == 0) {
    fatal_error("Directive not allowed in the current section!");
  }
  iVar1 = bank;
  (*opproc)(ip);
  if (1 < (uint)opval) {
    if (opval - 0x21U < 2) goto LAB_0010a941;
    if (1 < opval - 0x32U) {
      if ((lastlabl != (t_symbol *)0x0) && (lastlabl->data_type != opval)) {
        lastlabl = (t_symbol *)0x0;
      }
      goto LAB_0010a941;
    }
  }
  if ((lastlabl != (t_symbol *)0x0) && (lastlabl->data_type != 0)) {
    lastlabl = (t_symbol *)0x0;
  }
LAB_0010a941:
  if ((((pass == 1) && (asm_opt[2] != 0)) &&
      ((opval == 7 || ((opval - 9U < 4 || (opval == 0x2a || opval == 0x2b)))))) &&
     ((bank != iVar1 && (uVar2 = ((bank - iVar1) + -1) * 0x2000 + loccnt, uVar2 != 0)))) {
    sprintf((char *)&size,"Warning, bank overflow by %i bytes!\n",(ulong)uVar2);
    warning((char *)&size);
  }
  return;
}

Assistant:

void
do_pseudo(int *ip)
{
	char str[80];
	int old_bank;
	int size;
	char check_opval_flag;                  //internal debug var

	check_opval_flag = pseudo_flag[opval];  //internal debug var

	/* check if the directive is allowed in the current section */
	if (!(pseudo_flag[opval] & (1 << section)))
	{
		fatal_error("Directive not allowed in the current section!");
	}

	/* save current location */
	old_bank = bank;

	/* execute directive */
	opproc(ip);

	/* reset last label pointer */
	switch (opval) {
	case P_VRAM:
	case P_PAL:
		break;

	case P_DB:
	case P_DW:
	case P_DWL:
	case P_DWH:
		if (lastlabl) {
			if(lastlabl->data_type != P_DB)
		 	   lastlabl = NULL;
		}
		break;

	default:
		if (lastlabl) {
			if(lastlabl->data_type != opval)
		 	   lastlabl = NULL;
		}
		break;
	}

	/* bank overflow warning */
	if (pass == LAST_PASS) {
		if (asm_opt[OPT_WARNING]) {
			switch (opval) {
			case P_INCBIN:
			case P_INCCHR:
			case P_INCSPR:
			case P_INCPAL:
			case P_INCBAT:
			case P_INCTILE:
			case P_INCMAP:
				if (bank != old_bank) {
					size = ((bank - old_bank - 1) * 8192) + loccnt;
					if (size) {
						sprintf(str, "Warning, bank overflow by %i bytes!\n", size);
						warning(str);
					}
				}
				break;
			}
		}
	}
}